

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void EccPoint_mult(uECC_word_t *result,uECC_word_t *point,uECC_word_t *scalar,uECC_word_t *initial_Z
                  ,bitcount_t num_bits,uECC_Curve curve)

{
  char num_words_00;
  uECC_word_t uVar1;
  long lVar2;
  wordcount_t num_words;
  uECC_word_t nb;
  bitcount_t i;
  uECC_word_t z [4];
  uECC_word_t Ry [2] [4];
  uECC_word_t Rx [2] [4];
  uECC_Curve curve_local;
  bitcount_t num_bits_local;
  uECC_word_t *initial_Z_local;
  uECC_word_t *scalar_local;
  uECC_word_t *point_local;
  uECC_word_t *result_local;
  
  num_words_00 = curve->num_words;
  Rx[1][3] = (uECC_word_t)curve;
  uECC_vli_set(Rx[0] + 3,point,num_words_00);
  uECC_vli_set(Ry[0] + 3,point + (int)num_words_00,num_words_00);
  XYcZ_initial_double(Rx[0] + 3,Ry[0] + 3,Ry[1] + 3,z + 3,initial_Z,(uECC_Curve)Rx[1][3]);
  for (nb._6_2_ = num_bits + -2; 0 < nb._6_2_; nb._6_2_ = nb._6_2_ + -1) {
    uVar1 = uECC_vli_testBit(scalar,nb._6_2_);
    lVar2 = (long)(int)(uint)((uVar1 != 0 ^ 0xffU) & 1);
    XYcZ_addC(Ry[2 - lVar2] + 3,Ry[-lVar2] + 3,Ry[lVar2 + 1] + 3,Ry[lVar2 + -1] + 3,
              (uECC_Curve)Rx[1][3]);
    XYcZ_add(Ry[lVar2 + 1] + 3,Ry[lVar2 + -1] + 3,Ry[2 - lVar2] + 3,Ry[-lVar2] + 3,
             (uECC_Curve)Rx[1][3]);
  }
  uVar1 = uECC_vli_testBit(scalar,0);
  lVar2 = (long)(int)(uint)((uVar1 != 0 ^ 0xffU) & 1);
  XYcZ_addC(Ry[2 - lVar2] + 3,Ry[-lVar2] + 3,Ry[lVar2 + 1] + 3,Ry[lVar2 + -1] + 3,
            (uECC_Curve)Rx[1][3]);
  uECC_vli_modSub((uECC_word_t *)&stack0xffffffffffffff28,Rx[0] + 3,Ry[1] + 3,
                  (uECC_word_t *)(Rx[1][3] + 8),num_words_00);
  uECC_vli_modMult_fast
            ((uECC_word_t *)&stack0xffffffffffffff28,(uECC_word_t *)&stack0xffffffffffffff28,
             Ry[-lVar2] + 3,(uECC_Curve)Rx[1][3]);
  uECC_vli_modMult_fast
            ((uECC_word_t *)&stack0xffffffffffffff28,(uECC_word_t *)&stack0xffffffffffffff28,point,
             (uECC_Curve)Rx[1][3]);
  uECC_vli_modInv((uECC_word_t *)&stack0xffffffffffffff28,(uECC_word_t *)&stack0xffffffffffffff28,
                  (uECC_word_t *)(Rx[1][3] + 8),num_words_00);
  uECC_vli_modMult_fast
            ((uECC_word_t *)&stack0xffffffffffffff28,(uECC_word_t *)&stack0xffffffffffffff28,
             point + (int)num_words_00,(uECC_Curve)Rx[1][3]);
  uECC_vli_modMult_fast
            ((uECC_word_t *)&stack0xffffffffffffff28,(uECC_word_t *)&stack0xffffffffffffff28,
             Ry[2 - lVar2] + 3,(uECC_Curve)Rx[1][3]);
  XYcZ_add(Ry[lVar2 + 1] + 3,Ry[lVar2 + -1] + 3,Ry[2 - lVar2] + 3,Ry[-lVar2] + 3,
           (uECC_Curve)Rx[1][3]);
  apply_z(Ry[1] + 3,z + 3,(uECC_word_t *)&stack0xffffffffffffff28,(uECC_Curve)Rx[1][3]);
  uECC_vli_set(result,Ry[1] + 3,num_words_00);
  uECC_vli_set(result + (int)num_words_00,z + 3,num_words_00);
  return;
}

Assistant:

static void EccPoint_mult(uECC_word_t * result,
                          const uECC_word_t * point,
                          const uECC_word_t * scalar,
                          const uECC_word_t * initial_Z,
                          bitcount_t num_bits,
                          uECC_Curve curve) {
    /* R0 and R1 */
    uECC_word_t Rx[2][uECC_MAX_WORDS];
    uECC_word_t Ry[2][uECC_MAX_WORDS];
    uECC_word_t z[uECC_MAX_WORDS];
    bitcount_t i;
    uECC_word_t nb;
    wordcount_t num_words = curve->num_words;

    uECC_vli_set(Rx[1], point, num_words);
    uECC_vli_set(Ry[1], point + num_words, num_words);

    XYcZ_initial_double(Rx[1], Ry[1], Rx[0], Ry[0], initial_Z, curve);

    for (i = num_bits - 2; i > 0; --i) {
        nb = !uECC_vli_testBit(scalar, i);
        XYcZ_addC(Rx[1 - nb], Ry[1 - nb], Rx[nb], Ry[nb], curve);
        XYcZ_add(Rx[nb], Ry[nb], Rx[1 - nb], Ry[1 - nb], curve);
    }

    nb = !uECC_vli_testBit(scalar, 0);
    XYcZ_addC(Rx[1 - nb], Ry[1 - nb], Rx[nb], Ry[nb], curve);

    /* Find final 1/Z value. */
    uECC_vli_modSub(z, Rx[1], Rx[0], curve->p, num_words); /* X1 - X0 */
    uECC_vli_modMult_fast(z, z, Ry[1 - nb], curve);               /* Yb * (X1 - X0) */
    uECC_vli_modMult_fast(z, z, point, curve);                    /* xP * Yb * (X1 - X0) */
    uECC_vli_modInv(z, z, curve->p, num_words);            /* 1 / (xP * Yb * (X1 - X0)) */
    /* yP / (xP * Yb * (X1 - X0)) */
    uECC_vli_modMult_fast(z, z, point + num_words, curve);
    uECC_vli_modMult_fast(z, z, Rx[1 - nb], curve); /* Xb * yP / (xP * Yb * (X1 - X0)) */
    /* End 1/Z calculation */

    XYcZ_add(Rx[nb], Ry[nb], Rx[1 - nb], Ry[1 - nb], curve);
    apply_z(Rx[0], Ry[0], z, curve);

    uECC_vli_set(result, Rx[0], num_words);
    uECC_vli_set(result + num_words, Ry[0], num_words);
}